

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  int iVar1;
  size_t max;
  byte *pbVar2;
  ushort **ppuVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  byte *__s;
  byte bVar9;
  char *pcVar10;
  byte *pbVar11;
  bool bVar12;
  char *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
  uVar4 = 0;
LAB_0012756a:
  pcVar10 = conn_to_host->data;
  if (*pcVar10 == ':') {
LAB_00127603:
    if (pcVar10[1] == ':') {
      pcVar10 = pcVar10 + 2;
LAB_00127612:
      if (*pcVar10 != '\0') {
        pbVar2 = (byte *)(*Curl_cstrdup)(pcVar10);
        if (pbVar2 == (byte *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        __s = pbVar2;
        pbVar11 = pbVar2;
        if (*pbVar2 == 0x5b) {
          pbVar11 = pbVar2 + 1;
          bVar9 = pbVar2[1];
          __s = pbVar11;
          if (bVar9 != 0) {
            ppuVar3 = __ctype_b_loc();
            do {
              if (((((*ppuVar3)[bVar9] >> 0xc & 1) == 0) && (bVar9 != 0x2e)) && (bVar9 != 0x3a)) {
                if (bVar9 != 0x25) goto LAB_00127914;
                bVar9 = __s[1];
                if (bVar9 - 0x32 == 0) {
                  iVar1 = 0x35 - (uint)__s[2];
                }
                else {
                  iVar1 = -(bVar9 - 0x32);
                }
                __s = __s + 1;
                if (iVar1 != 0) {
                  Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                  bVar9 = *__s;
                }
                if (bVar9 != 0) {
                  goto LAB_001278e0;
                }
                break;
              }
              bVar9 = __s[1];
              __s = __s + 1;
            } while (bVar9 != 0);
          }
          goto LAB_0012768f;
        }
        goto LAB_001276a6;
      }
      goto LAB_0012772b;
    }
    pcVar6 = strchr(pcVar10 + 1,0x3a);
    if (pcVar6 != (char *)0x0) {
      local_38 = (char *)0x0;
      lVar5 = strtol(pcVar10 + 1,&local_38,10);
      if ((local_38 == pcVar6) && (lVar5 == conn->remote_port)) {
        pcVar10 = pcVar6 + 1;
        goto LAB_00127612;
      }
    }
    goto LAB_0012778d;
  }
  bVar12 = (conn->bits).ipv6_ip != false;
  pcVar6 = "";
  pcVar7 = "";
  if (bVar12) {
    pcVar7 = "[";
  }
  if (bVar12) {
    pcVar6 = "]";
  }
  pcVar6 = curl_maprintf("%s%s%s",pcVar7,(conn->host).name,pcVar6);
  if (pcVar6 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  max = strlen(pcVar6);
  iVar1 = curl_strnequal(pcVar10,pcVar6,max);
  (*Curl_cfree)(pcVar6);
  if ((iVar1 != 0) && (pcVar10[max] == ':')) {
    pcVar10 = pcVar10 + max;
    goto LAB_00127603;
  }
  pcVar10 = (char *)0x0;
  goto LAB_00127790;
  while( true ) {
    bVar9 = __s[1];
    __s = __s + 1;
    if (bVar9 == 0) break;
LAB_001278e0:
    if (((((*ppuVar3)[bVar9] & 0x1400) == 0) && (1 < bVar9 - 0x2d)) &&
       ((bVar9 != 0x5f && (bVar9 != 0x7e)))) goto LAB_00127914;
  }
LAB_0012768f:
  Curl_infof(data,"Invalid IPv6 address format\n");
LAB_001276a6:
  pcVar10 = strchr((char *)__s,0x3a);
  if (pcVar10 == (char *)0x0) {
LAB_001277f7:
    uVar4 = 0xffffffff;
LAB_001277fd:
    pcVar10 = (*Curl_cstrdup)((char *)pbVar11);
    (*Curl_cfree)(pbVar2);
    if (pcVar10 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*pcVar10 != '\0') {
      (conn->conn_to_host).rawalloc = pcVar10;
      (conn->conn_to_host).name = pcVar10;
      (conn->bits).conn_to_host = true;
      pcVar6 = strchr(pcVar10,0x3a);
      pcVar7 = "[";
      if (pcVar6 == (char *)0x0) {
        pcVar7 = "";
      }
      pcVar8 = "]";
      if (pcVar6 == (char *)0x0) {
        pcVar8 = "";
      }
      bVar12 = false;
      Curl_infof(data,"Connecting to hostname: %s%s%s\n",pcVar7,pcVar10,pcVar8);
      goto LAB_001277ab;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar10 = '\0';
    if (pcVar10[1] == '\0') goto LAB_001277f7;
    uVar4 = strtol(pcVar10 + 1,&local_38,10);
    if (((local_38 == (char *)0x0) || (*local_38 == '\0')) && (uVar4 < 0x10000)) goto LAB_001277fd;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar10 + 1);
    (*Curl_cfree)(pbVar2);
LAB_0012772b:
    uVar4 = 0xffffffff;
LAB_0012778d:
    pcVar10 = (char *)0x0;
  }
LAB_00127790:
  (conn->bits).conn_to_host = false;
  (*Curl_cfree)(pcVar10);
  bVar12 = pcVar10 == (char *)0x0;
LAB_001277ab:
  if ((int)uVar4 < 0) {
    (conn->bits).conn_to_port = false;
  }
  else {
    conn->conn_to_port = (int)uVar4;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n",uVar4 & 0xffffffff);
  }
  conn_to_host = conn_to_host->next;
  if (!(bool)(bVar12 & conn_to_host != (curl_slist *)0x0)) {
    return CURLE_OK;
  }
  goto LAB_0012756a;
LAB_00127914:
  if (bVar9 != 0x5d) goto LAB_0012768f;
  *__s = 0;
  __s = __s + 1;
  goto LAB_001276a6;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = 0;

  while(conn_to_host && !host) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      bool ipv6host;
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      ipv6host = strchr(host, ':') != NULL;
      infof(data, "Connecting to hostname: %s%s%s\n",
            ipv6host ? "[" : "", host, ipv6host ? "]" : "");
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      free(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}